

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::CollectionScanState::Initialize
          (CollectionScanState *this,vector<duckdb::LogicalType,_true> *types)

{
  vector<duckdb::StorageIndex,_true> *this_00;
  TableScanState *pTVar1;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var2;
  pointer __p;
  const_reference pvVar3;
  const_reference type;
  idx_t i;
  ulong __n;
  long lVar4;
  pointer local_38;
  
  pTVar1 = this->parent;
  this_00 = &pTVar1->column_ids;
  make_unsafe_uniq_array<duckdb::ColumnScanState>
            ((duckdb *)&local_38,
             (long)(pTVar1->column_ids).
                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar1->column_ids).
                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  __p = local_38;
  local_38 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>::
  reset((__uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_> *
        )&this->column_scans,__p);
  ::std::unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>::
  ~unique_ptr((unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
               *)&local_38);
  lVar4 = 0;
  for (__n = 0; __n < (ulong)((long)(pTVar1->column_ids).
                                    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    .
                                    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar1->column_ids).
                                    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    .
                                    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar3 = vector<duckdb::StorageIndex,_true>::get<true>(this_00,__n);
    if (pvVar3->index != 0xffffffffffffffff) {
      pvVar3 = vector<duckdb::StorageIndex,_true>::get<true>(this_00,__n);
      _Var2._M_head_impl =
           (this->column_scans).
           super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
           .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
      type = vector<duckdb::LogicalType,_true>::get<true>(types,pvVar3->index);
      pvVar3 = vector<duckdb::StorageIndex,_true>::get<true>(this_00,__n);
      ColumnScanState::Initialize
                ((ColumnScanState *)((long)&(_Var2._M_head_impl)->current + lVar4),type,
                 &pvVar3->child_indexes,
                 (optional_ptr<duckdb::TableScanOptions,_true>)&this->parent->options);
    }
    lVar4 = lVar4 + 0x98;
  }
  return;
}

Assistant:

void CollectionScanState::Initialize(const vector<LogicalType> &types) {
	auto &column_ids = GetColumnIds();
	column_scans = make_unsafe_uniq_array<ColumnScanState>(column_ids.size());
	for (idx_t i = 0; i < column_ids.size(); i++) {
		if (column_ids[i].IsRowIdColumn()) {
			continue;
		}
		auto col_id = column_ids[i].GetPrimaryIndex();
		column_scans[i].Initialize(types[col_id], column_ids[i].GetChildIndexes(), &GetOptions());
	}
}